

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseContextBase.cpp
# Opt level: O0

void __thiscall glslang::TParseContextBase::finish(TParseContextBase *this)

{
  TIntermediate *pTVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  EShLanguage language;
  reference name;
  TSymbol *pTVar5;
  undefined4 extraout_var;
  vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *this_00;
  reference pTVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TIntermAggregate *this_01;
  reference ppTVar7;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
  *__rhs;
  __normal_iterator<glslang::TSymbol_**,_std::vector<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>_>
  local_b0;
  __normal_iterator<glslang::TSymbol_**,_std::vector<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>_>
  local_a8;
  iterator i;
  TIntermAggregate *linkage;
  undefined1 local_90 [8];
  TString fieldName;
  TTypeLoc *typeLoc;
  const_iterator __end2;
  const_iterator __begin2;
  TTypeList *__range2;
  TType *type;
  TSymbol *symbol;
  TString *relaxedSymbol;
  iterator __end1;
  iterator __begin1;
  TVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>
  *__range1;
  TParseContextBase *this_local;
  
  if ((this->parsingBuiltins & 1U) == 0) {
    __end1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
             ::begin(&(this->relaxedSymbols).
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
                    );
    relaxedSymbol =
         (TString *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
         ::end(&(this->relaxedSymbols).
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
              );
    while( true ) {
      __rhs = (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
               *)&relaxedSymbol;
      bVar2 = __gnu_cxx::operator!=(&__end1,__rhs);
      if (!bVar2) break;
      name = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
             ::operator*(&__end1);
      pTVar5 = TSymbolTable::find(this->symbolTable,name,(bool *)0x0,(bool *)0x0,(int *)0x0);
      iVar3 = (*pTVar5->_vptr_TSymbol[0xd])();
      this_00 = &TType::getStruct((TType *)CONCAT44(extraout_var,iVar3))->
                 super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
      __end2 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::begin
                         (this_00);
      typeLoc = (TTypeLoc *)
                std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::end
                          (this_00);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<const_glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                                         *)&typeLoc), bVar2) {
        pTVar6 = __gnu_cxx::
                 __normal_iterator<const_glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                 ::operator*(&__end2);
        uVar4 = (*pTVar6->type->_vptr_TType[0x28])();
        if ((uVar4 & 1) != 0) {
          fieldName.field_2._12_4_ = fieldName.field_2._12_4_ & 0x80000000;
          iVar3 = (*pTVar6->type->_vptr_TType[9])();
          *(undefined4 *)CONCAT44(extraout_var_00,iVar3) = fieldName.field_2._12_4_;
          fieldName.field_2._8_4_ = 8;
          TType::setBasicType(pTVar6->type,(TBasicType *)(fieldName.field_2._M_local_buf + 8));
          pool_allocator<char>::pool_allocator((pool_allocator<char> *)&linkage);
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          basic_string<glslang::std::allocator<char>>
                    ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                     local_90,"/*",(pool_allocator<char> *)&linkage);
          iVar3 = (*pTVar6->type->_vptr_TType[6])();
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          append((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                 local_90,(basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                           *)CONCAT44(extraout_var_01,iVar3));
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          append((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                 local_90,"*/");
          (*pTVar6->type->_vptr_TType[4])(pTVar6->type,local_90);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          ~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         *)local_90);
        }
        __gnu_cxx::
        __normal_iterator<const_glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
        ::operator++(&__end2);
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    this_01 = (TIntermAggregate *)TIntermNode::operator_new((TIntermNode *)0x188,(size_t)__rhs);
    TIntermAggregate::TIntermAggregate(this_01);
    i._M_current = (TSymbol **)this_01;
    local_a8._M_current =
         (TSymbol **)
         std::vector<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>::begin
                   (&(this->linkageSymbols).
                     super_vector<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>)
    ;
    while( true ) {
      local_b0._M_current =
           (TSymbol **)
           std::vector<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>::end
                     (&(this->linkageSymbols).
                       super_vector<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>
                     );
      bVar2 = __gnu_cxx::operator!=(&local_a8,&local_b0);
      if (!bVar2) break;
      pTVar1 = (this->super_TParseVersions).intermediate;
      ppTVar7 = __gnu_cxx::
                __normal_iterator<glslang::TSymbol_**,_std::vector<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>_>
                ::operator*(&local_a8);
      TIntermediate::addSymbolLinkageNode(pTVar1,(TIntermAggregate **)&i,*ppTVar7);
      __gnu_cxx::
      __normal_iterator<glslang::TSymbol_**,_std::vector<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>_>
      ::operator++(&local_a8);
    }
    pTVar1 = (this->super_TParseVersions).intermediate;
    language = getLanguage(this);
    TIntermediate::addSymbolLinkageNodes(pTVar1,(TIntermAggregate **)&i,language,this->symbolTable);
  }
  return;
}

Assistant:

void TParseContextBase::finish()
{
    if (parsingBuiltins)
        return;

    for (const TString& relaxedSymbol : relaxedSymbols)
    {
        TSymbol* symbol = symbolTable.find(relaxedSymbol);
        TType& type = symbol->getWritableType();
        for (const TTypeLoc& typeLoc : *type.getStruct())
        {
            if (typeLoc.type->isOpaque())
            {
                typeLoc.type->getSampler() = TSampler{};
                typeLoc.type->setBasicType(EbtInt);
                TString fieldName("/*");
                fieldName.append(typeLoc.type->getFieldName());
                fieldName.append("*/");
                typeLoc.type->setFieldName(fieldName);
            }
        }
    }

    // Transfer the linkage symbols to AST nodes, preserving order.
    TIntermAggregate* linkage = new TIntermAggregate;
    for (auto i = linkageSymbols.begin(); i != linkageSymbols.end(); ++i)
        intermediate.addSymbolLinkageNode(linkage, **i);
    intermediate.addSymbolLinkageNodes(linkage, getLanguage(), symbolTable);
}